

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void units::addUnitPower(string *str,char *unit,int power,uint64_t flags)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  
  if (power != 0) {
    do {
      if ((str->_M_string_length == 0) ||
         (cVar3 = (str->_M_dataplus)._M_p[str->_M_string_length - 1], cVar3 == '*')) {
LAB_003a7653:
        bVar1 = false;
      }
      else {
        bVar1 = true;
        if (cVar3 != '/') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,'*');
          goto LAB_003a7653;
        }
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,unit);
      if (power == 1) {
        return;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,'^');
      uVar2 = -power;
      if (0 < power) {
        uVar2 = power;
      }
      if (uVar2 < 10) {
        cVar3 = (char)power;
        if (power < 0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,'-');
          cVar3 = -cVar3;
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,
                  cVar3 + '0');
        return;
      }
      iVar4 = -9;
      if (power < 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,'-');
        iVar4 = 9;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,'9');
      if (bVar1) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,'/');
      }
      power = power + iVar4;
    } while (power != 0);
  }
  return;
}

Assistant:

static void addUnitPower(
    std::string& str,
    const char* unit,
    int power,
    std::uint64_t flags)
{
    bool div{false};
    if (power != 0) {
        if (!str.empty()) {
            if (str.back() != '/') {
                if (str.back() != '*') {
                    str.push_back('*');
                }
            } else {
                div = true;
            }
        }

        str.append(unit);
        if (power != 1) {
            str.push_back('^');
            if (std::labs(power) < 10) {
                if (power < 0) {
                    str.push_back('-');
                    str.push_back('0' - power);
                } else {
                    str.push_back('0' + power);
                }
            } else {
                if (allowLargePowers(flags)) {
                    str.push_back('(');
                    str.append(std::to_string(power));
                    str.push_back(')');
                } else {
                    if (power < 0) {
                        str.push_back('-');
                        str.push_back('9');
                        power += 9;
                    } else {
                        str.push_back('9');
                        power -= 9;
                    }
                    if (div) {
                        str.push_back('/');
                    }
                    addUnitPower(str, unit, power, flags);
                }
            }
        }
    }
}